

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVector<ImVec2> *this_00;
  int in_ECX;
  float *pfVar1;
  int in_EDX;
  float *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  ImVec2 *c;
  int a;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVector<ImVec2> *in_stack_ffffffffffffffc0;
  ImVec2 in_stack_ffffffffffffffd0;
  int local_20;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    ImVector<ImVec2>::reserve
              ((ImVector<ImVec2> *)in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
    for (local_20 = in_EDX; local_20 <= in_ECX; local_20 = local_20 + 1) {
      pfVar1 = (float *)(*(long *)(in_RDI + 0x38) + 0x30 + (long)(local_20 % 0xc) * 8);
      this_00 = (ImVector<ImVec2> *)(in_RDI + 0x78);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,*pfVar1 * in_XMM0_Da + *in_RSI,
                     pfVar1[1] * in_XMM0_Da + in_RSI[1]);
      ImVector<ImVec2>::push_back(this_00,in_stack_ffffffffffffffb8);
    }
  }
  else {
    ImVector<ImVec2>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f)
    {
        _Path.push_back(center);
        return;
    }
    IM_ASSERT(a_min_of_12 <= a_max_of_12);

    // For legacy reason the PathArcToFast() always takes angles where 2*PI is represented by 12,
    // but it is possible to set IM_DRAWLIST_ARCFAST_TESSELATION_MULTIPLIER to a higher value. This should compile to a no-op otherwise.
#if IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER != 1
    a_min_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
    a_max_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
#endif

    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->ArcFastVtx[a % IM_ARRAYSIZE(_Data->ArcFastVtx)];
        _Path.push_back(ImVec2(center.x + c.x * radius, center.y + c.y * radius));
    }
}